

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O3

bool __thiscall serial::Serial::SerialImpl::getDSR(SerialImpl *this)

{
  int iVar1;
  PortNotOpenedException *this_00;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  SerialException *this_01;
  int status;
  stringstream ss;
  undefined1 local_1c4;
  byte bStack_1c3;
  char *local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (this->is_open_ == false) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x28);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::getDSR");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  iVar1 = ioctl(this->fd_,0x5415,&local_1c4);
  if (iVar1 != -1) {
    return (bool)(bStack_1c3 & 1);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"getDSR failed on a call to ioctl(TIOCMGET): ",0x2c);
  piVar2 = __errno_location();
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,*piVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pcVar4 = strerror(*piVar2);
  std::operator<<(poVar3,pcVar4);
  this_01 = (SerialException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  SerialException::SerialException(this_01,local_1c0);
  __cxa_throw(this_01,&SerialException::typeinfo,SerialException::~SerialException);
}

Assistant:

bool
Serial::SerialImpl::getDSR ()
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::getDSR");
  }

  int status;

  if (-1 == ioctl (fd_, TIOCMGET, &status))
  {
      stringstream ss;
      ss << "getDSR failed on a call to ioctl(TIOCMGET): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
  }
  else
  {
      return 0 != (status & TIOCM_DSR);
  }
}